

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O1

ASN1_TEMPLATE * asn1_do_adb(ASN1_VALUE **pval,ASN1_TEMPLATE *tt,int nullerr)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ASN1_TEMPLATE *pAVar5;
  
  uVar1 = (uint)tt->flags;
  if ((uVar1 & 0x300) != 0) {
    pcVar2 = tt->field_name;
    if (*(ASN1_OBJECT **)(*pval + *(long *)(pcVar2 + 8)) == (ASN1_OBJECT *)0x0) {
      tt = *(ASN1_TEMPLATE **)(pcVar2 + 0x30);
    }
    else {
      if ((uVar1 >> 8 & 1) == 0) {
        __assert_fail("tt->flags & ASN1_TFLG_ADB_OID",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_utl.cc"
                      ,0xc9,
                      "const ASN1_TEMPLATE *asn1_do_adb(ASN1_VALUE **, const ASN1_TEMPLATE *, int)")
        ;
      }
      iVar3 = OBJ_obj2nid(*(ASN1_OBJECT **)(*pval + *(long *)(pcVar2 + 8)));
      lVar4 = *(long *)(pcVar2 + 0x20);
      if (0 < lVar4) {
        pAVar5 = (ASN1_TEMPLATE *)(*(long *)(pcVar2 + 0x18) + 8);
        do {
          if (*(int *)&pAVar5[-1].item == iVar3) {
            return pAVar5;
          }
          pAVar5 = pAVar5 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      tt = *(ASN1_TEMPLATE **)(pcVar2 + 0x28);
    }
    if (tt == (ASN1_TEMPLATE *)0x0) {
      if (nullerr == 0) {
        tt = (ASN1_TEMPLATE *)0x0;
      }
      else {
        tt = (ASN1_TEMPLATE *)0x0;
        ERR_put_error(0xc,0,0xba,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_utl.cc"
                      ,0xe2);
      }
    }
  }
  return tt;
}

Assistant:

const ASN1_TEMPLATE *asn1_do_adb(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt,
                                 int nullerr) {
  const ASN1_ADB *adb;
  const ASN1_ADB_TABLE *atbl;
  ASN1_VALUE **sfld;
  int i;
  if (!(tt->flags & ASN1_TFLG_ADB_MASK)) {
    return tt;
  }

  // Else ANY DEFINED BY ... get the table
  adb = ASN1_ADB_ptr(tt->item);

  // Get the selector field
  sfld = reinterpret_cast<ASN1_VALUE **>(offset2ptr(*pval, adb->offset));

  // Check if NULL
  int selector;
  if (*sfld == NULL) {
    if (!adb->null_tt) {
      goto err;
    }
    return adb->null_tt;
  }

  // Convert type to a NID:
  // NB: don't check for NID_undef here because it
  // might be a legitimate value in the table
  assert(tt->flags & ASN1_TFLG_ADB_OID);
  selector = OBJ_obj2nid((ASN1_OBJECT *)*sfld);

  // Try to find matching entry in table Maybe should check application types
  // first to allow application override? Might also be useful to have a flag
  // which indicates table is sorted and we can do a binary search. For now
  // stick to a linear search.

  for (atbl = adb->tbl, i = 0; i < adb->tblcount; i++, atbl++) {
    if (atbl->value == selector) {
      return &atbl->tt;
    }
  }

  // FIXME: need to search application table too

  // No match, return default type
  if (!adb->default_tt) {
    goto err;
  }
  return adb->default_tt;

err:
  // FIXME: should log the value or OID of unsupported type
  if (nullerr) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNSUPPORTED_ANY_DEFINED_BY_TYPE);
  }
  return NULL;
}